

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O3

void __thiscall
soplex::
SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::factorize(SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this)

{
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *this_00;
  uint uVar1;
  undefined8 uVar2;
  int iVar3;
  long_long_type lVar4;
  undefined8 *puVar5;
  long lVar6;
  ulong i;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<100U,_int,_void> local_178;
  cpp_dec_float<100U,_int,_void> local_128;
  cpp_dec_float<100U,_int,_void> local_d0;
  cpp_dec_float<100U,_int,_void> local_80;
  
  if (this->matrixIsSetup == false) {
    (*this->_vptr_SPxBasisBase[5])(this,&this->thedesc);
  }
  this->updateCount = 0;
  iVar3 = (*this->factor->_vptr_SLinSolver[5])
                    (this->factor,(this->matrix).data,(ulong)(uint)(this->matrix).thesize);
  if (iVar3 == 2) {
    if (this->thestatus != SINGULAR) {
      this->thestatus = SINGULAR;
    }
    this->factorized = false;
  }
  else {
    if (iVar3 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"EBASIS08 error: unknown status of factorization.\n",0x31);
      this->factorized = false;
      puVar5 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_178.data._M_elems._0_8_ = local_178.data._M_elems + 4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_178,"XBASIS01 This should never happen.","");
      *puVar5 = &PTR__SPxException_0069d438;
      puVar5[1] = puVar5 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar5 + 1),local_178.data._M_elems._0_8_,
                 local_178.data._M_elems._0_8_ + local_178.data._M_elems._8_8_);
      *puVar5 = &PTR__SPxException_0069d410;
      __cxa_throw(puVar5,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    }
    if (this->thestatus == SINGULAR) {
      this->thestatus = REGULAR;
    }
    this->factorized = true;
    (*this->factor->_vptr_SLinSolver[6])(&local_178);
    this_00 = &this->minStab;
    *(undefined8 *)((this->minStab).m_backend.data._M_elems + 0xc) = local_178.data._M_elems._48_8_;
    *(ulong *)((this->minStab).m_backend.data._M_elems + 0xe) =
         CONCAT35(local_178.data._M_elems[0xf]._1_3_,local_178.data._M_elems._56_5_);
    *(undefined8 *)((this->minStab).m_backend.data._M_elems + 8) = local_178.data._M_elems._32_8_;
    *(undefined8 *)((this->minStab).m_backend.data._M_elems + 10) = local_178.data._M_elems._40_8_;
    *(undefined8 *)((this->minStab).m_backend.data._M_elems + 4) = local_178.data._M_elems._16_8_;
    *(undefined8 *)((this->minStab).m_backend.data._M_elems + 6) = local_178.data._M_elems._24_8_;
    *(undefined8 *)(this->minStab).m_backend.data._M_elems = local_178.data._M_elems._0_8_;
    *(undefined8 *)((this->minStab).m_backend.data._M_elems + 2) = local_178.data._M_elems._8_8_;
    (this->minStab).m_backend.exp = local_178.exp;
    (this->minStab).m_backend.neg = local_178.neg;
    (this->minStab).m_backend.fpclass = local_178.fpclass;
    (this->minStab).m_backend.prec_elem = local_178.prec_elem;
    if (local_178.fpclass != cpp_dec_float_NaN) {
      local_178.fpclass = cpp_dec_float_finite;
      local_178.prec_elem = 0x10;
      local_178.data._M_elems[0] = 0;
      local_178.data._M_elems[1] = 0;
      local_178.data._M_elems[2] = 0;
      local_178.data._M_elems[3] = 0;
      local_178.data._M_elems[4] = 0;
      local_178.data._M_elems[5] = 0;
      local_178.data._M_elems[6] = 0;
      local_178.data._M_elems[7] = 0;
      local_178.data._M_elems[8] = 0;
      local_178.data._M_elems[9] = 0;
      local_178.data._M_elems[10] = 0;
      local_178.data._M_elems[0xb] = 0;
      local_178.data._M_elems[0xc] = 0;
      local_178.data._M_elems[0xd] = 0;
      local_178.data._M_elems._56_5_ = 0;
      local_178.data._M_elems[0xf]._1_3_ = 0;
      local_178.exp = 0;
      local_178.neg = false;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_178,0.0001);
      iVar3 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                        (&this_00->m_backend,&local_178);
      if (0 < iVar3) {
        local_178.fpclass = cpp_dec_float_finite;
        local_178.prec_elem = 0x10;
        local_178.data._M_elems[0] = 0;
        local_178.data._M_elems[1] = 0;
        local_178.data._M_elems[2] = 0;
        local_178.data._M_elems[3] = 0;
        local_178.data._M_elems[4] = 0;
        local_178.data._M_elems[5] = 0;
        local_178.data._M_elems[6] = 0;
        local_178.data._M_elems[7] = 0;
        local_178.data._M_elems[8] = 0;
        local_178.data._M_elems[9] = 0;
        local_178.data._M_elems[10] = 0;
        local_178.data._M_elems[0xb] = 0;
        local_178.data._M_elems[0xc] = 0;
        local_178.data._M_elems[0xd] = 0;
        local_178.data._M_elems._56_5_ = 0;
        local_178.data._M_elems[0xf]._1_3_ = 0;
        local_178.exp = 0;
        local_178.neg = false;
        boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                  ((cpp_dec_float<100u,int,void> *)&local_178,0.001);
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                  (&this_00->m_backend,&local_178);
      }
    }
    if ((this->minStab).m_backend.fpclass != cpp_dec_float_NaN) {
      local_178.fpclass = cpp_dec_float_finite;
      local_178.prec_elem = 0x10;
      local_178.data._M_elems[0] = 0;
      local_178.data._M_elems[1] = 0;
      local_178.data._M_elems[2] = 0;
      local_178.data._M_elems[3] = 0;
      local_178.data._M_elems[4] = 0;
      local_178.data._M_elems[5] = 0;
      local_178.data._M_elems[6] = 0;
      local_178.data._M_elems[7] = 0;
      local_178.data._M_elems[8] = 0;
      local_178.data._M_elems[9] = 0;
      local_178.data._M_elems[10] = 0;
      local_178.data._M_elems[0xb] = 0;
      local_178.data._M_elems[0xc] = 0;
      local_178.data._M_elems[0xd] = 0;
      local_178.data._M_elems._56_5_ = 0;
      local_178.data._M_elems[0xf]._1_3_ = 0;
      local_178.exp = 0;
      local_178.neg = false;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_178,1e-05);
      iVar3 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                        (&this_00->m_backend,&local_178);
      if (0 < iVar3) {
        local_178.fpclass = cpp_dec_float_finite;
        local_178.prec_elem = 0x10;
        local_178.data._M_elems[0] = 0;
        local_178.data._M_elems[1] = 0;
        local_178.data._M_elems[2] = 0;
        local_178.data._M_elems[3] = 0;
        local_178.data._M_elems[4] = 0;
        local_178.data._M_elems[5] = 0;
        local_178.data._M_elems[6] = 0;
        local_178.data._M_elems[7] = 0;
        local_178.data._M_elems[8] = 0;
        local_178.data._M_elems[9] = 0;
        local_178.data._M_elems[10] = 0;
        local_178.data._M_elems[0xb] = 0;
        local_178.data._M_elems[0xc] = 0;
        local_178.data._M_elems[0xd] = 0;
        local_178.data._M_elems._56_5_ = 0;
        local_178.data._M_elems[0xf]._1_3_ = 0;
        local_178.exp = 0;
        local_178.neg = false;
        boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                  ((cpp_dec_float<100u,int,void> *)&local_178,0.01);
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                  (&this_00->m_backend,&local_178);
      }
      if ((this->minStab).m_backend.fpclass != cpp_dec_float_NaN) {
        local_178.fpclass = cpp_dec_float_finite;
        local_178.prec_elem = 0x10;
        local_178.data._M_elems[0] = 0;
        local_178.data._M_elems[1] = 0;
        local_178.data._M_elems[2] = 0;
        local_178.data._M_elems[3] = 0;
        local_178.data._M_elems[4] = 0;
        local_178.data._M_elems[5] = 0;
        local_178.data._M_elems[6] = 0;
        local_178.data._M_elems[7] = 0;
        local_178.data._M_elems[8] = 0;
        local_178.data._M_elems[9] = 0;
        local_178.data._M_elems[10] = 0;
        local_178.data._M_elems[0xb] = 0;
        local_178.data._M_elems[0xc] = 0;
        local_178.data._M_elems[0xd] = 0;
        local_178.data._M_elems._56_5_ = 0;
        local_178.data._M_elems[0xf]._1_3_ = 0;
        local_178.exp = 0;
        local_178.neg = false;
        boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                  ((cpp_dec_float<100u,int,void> *)&local_178,1e-06);
        iVar3 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                          (&this_00->m_backend,&local_178);
        if (0 < iVar3) {
          local_178.fpclass = cpp_dec_float_finite;
          local_178.prec_elem = 0x10;
          local_178.data._M_elems[0] = 0;
          local_178.data._M_elems[1] = 0;
          local_178.data._M_elems[2] = 0;
          local_178.data._M_elems[3] = 0;
          local_178.data._M_elems[4] = 0;
          local_178.data._M_elems[5] = 0;
          local_178.data._M_elems[6] = 0;
          local_178.data._M_elems[7] = 0;
          local_178.data._M_elems[8] = 0;
          local_178.data._M_elems[9] = 0;
          local_178.data._M_elems[10] = 0;
          local_178.data._M_elems[0xb] = 0;
          local_178.data._M_elems[0xc] = 0;
          local_178.data._M_elems[0xd] = 0;
          local_178.data._M_elems._56_5_ = 0;
          local_178.data._M_elems[0xf]._1_3_ = 0;
          local_178.exp = 0;
          local_178.neg = false;
          boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                    ((cpp_dec_float<100u,int,void> *)&local_178,0.1);
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                    (&this_00->m_backend,&local_178);
        }
      }
    }
  }
  iVar3 = (*this->factor->_vptr_SLinSolver[3])();
  this->lastMem = iVar3;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            (&local_d0,(long)iVar3,(type *)0x0);
  local_128.fpclass = cpp_dec_float_finite;
  local_128.prec_elem = 0x10;
  local_128.data._M_elems[0] = 0;
  local_128.data._M_elems[1] = 0;
  local_128.data._M_elems[2] = 0;
  local_128.data._M_elems[3] = 0;
  local_128.data._M_elems[4] = 0;
  local_128.data._M_elems[5] = 0;
  local_128.data._M_elems[6] = 0;
  local_128.data._M_elems[7] = 0;
  local_128.data._M_elems[8] = 0;
  local_128.data._M_elems[9] = 0;
  local_128.data._M_elems[10] = 0;
  local_128.data._M_elems[0xb] = 0;
  local_128.data._M_elems[0xc] = 0;
  local_128.data._M_elems[0xd] = 0;
  local_128.data._M_elems._56_5_ = 0;
  local_128.data._M_elems[0xf]._1_3_ = 0;
  local_128.exp = 0;
  local_128.neg = false;
  if (&local_128 != &(this->fillFactor).m_backend) {
    local_128.data._M_elems._0_8_ = *(undefined8 *)(this->fillFactor).m_backend.data._M_elems;
    local_128.data._M_elems._8_8_ = *(undefined8 *)((this->fillFactor).m_backend.data._M_elems + 2);
    local_128.data._M_elems._16_8_ = *(undefined8 *)((this->fillFactor).m_backend.data._M_elems + 4)
    ;
    local_128.data._M_elems._24_8_ = *(undefined8 *)((this->fillFactor).m_backend.data._M_elems + 6)
    ;
    local_128.data._M_elems._32_8_ = *(undefined8 *)((this->fillFactor).m_backend.data._M_elems + 8)
    ;
    local_128.data._M_elems._40_8_ =
         *(undefined8 *)((this->fillFactor).m_backend.data._M_elems + 10);
    local_128.data._M_elems._48_8_ =
         *(undefined8 *)((this->fillFactor).m_backend.data._M_elems + 0xc);
    uVar2 = *(undefined8 *)((this->fillFactor).m_backend.data._M_elems + 0xe);
    local_128.data._M_elems._56_5_ = SUB85(uVar2,0);
    local_128.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar2 >> 0x28);
    local_128.exp = (this->fillFactor).m_backend.exp;
    local_128.neg = (this->fillFactor).m_backend.neg;
    local_128.fpclass = (this->fillFactor).m_backend.fpclass;
    local_128.prec_elem = (this->fillFactor).m_backend.prec_elem;
  }
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=(&local_128,&local_d0);
  i = (ulong)(uint)this->nzCount;
  if (this->nzCount < 2) {
    i = 1;
  }
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            (&local_80,i,(type *)0x0);
  local_178.fpclass = cpp_dec_float_finite;
  local_178.prec_elem = 0x10;
  local_178.data._M_elems[0] = 0;
  local_178.data._M_elems[1] = 0;
  local_178.data._M_elems[2] = 0;
  local_178.data._M_elems[3] = 0;
  local_178.data._M_elems[4] = 0;
  local_178.data._M_elems[5] = 0;
  local_178.data._M_elems[6] = 0;
  local_178.data._M_elems[7] = 0;
  local_178.data._M_elems[8] = 0;
  local_178.data._M_elems[9] = 0;
  local_178.data._M_elems[10] = 0;
  local_178.data._M_elems[0xb] = 0;
  local_178.data._M_elems[0xc] = 0;
  local_178.data._M_elems[0xd] = 0;
  local_178.data._M_elems._56_5_ = 0;
  local_178.data._M_elems[0xf]._1_3_ = 0;
  local_178.exp = 0;
  local_178.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
            (&local_178,&local_128,&local_80);
  *(undefined8 *)((this->lastFill).m_backend.data._M_elems + 0xc) = local_178.data._M_elems._48_8_;
  *(ulong *)((this->lastFill).m_backend.data._M_elems + 0xe) =
       CONCAT35(local_178.data._M_elems[0xf]._1_3_,local_178.data._M_elems._56_5_);
  *(undefined8 *)((this->lastFill).m_backend.data._M_elems + 8) = local_178.data._M_elems._32_8_;
  *(undefined8 *)((this->lastFill).m_backend.data._M_elems + 10) = local_178.data._M_elems._40_8_;
  *(undefined8 *)((this->lastFill).m_backend.data._M_elems + 4) = local_178.data._M_elems._16_8_;
  *(undefined8 *)((this->lastFill).m_backend.data._M_elems + 6) = local_178.data._M_elems._24_8_;
  *(undefined8 *)(this->lastFill).m_backend.data._M_elems = local_178.data._M_elems._0_8_;
  *(undefined8 *)((this->lastFill).m_backend.data._M_elems + 2) = local_178.data._M_elems._8_8_;
  (this->lastFill).m_backend.exp = local_178.exp;
  (this->lastFill).m_backend.neg = local_178.neg;
  (this->lastFill).m_backend.fpclass = local_178.fpclass;
  (this->lastFill).m_backend.prec_elem = local_178.prec_elem;
  uVar1 = 1;
  if (1 < this->nzCount) {
    uVar1 = this->nzCount;
  }
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            (&local_128,(ulong)uVar1,(type *)0x0);
  local_178.fpclass = cpp_dec_float_finite;
  local_178.prec_elem = 0x10;
  local_178.data._M_elems[0] = 0;
  local_178.data._M_elems[1] = 0;
  local_178.data._M_elems[2] = 0;
  local_178.data._M_elems[3] = 0;
  local_178.data._M_elems[4] = 0;
  local_178.data._M_elems[5] = 0;
  local_178.data._M_elems[6] = 0;
  local_178.data._M_elems[7] = 0;
  local_178.data._M_elems[8] = 0;
  local_178.data._M_elems[9] = 0;
  local_178.data._M_elems[10] = 0;
  local_178.data._M_elems[0xb] = 0;
  local_178.data._M_elems[0xc] = 0;
  local_178.data._M_elems[0xd] = 0;
  local_178.data._M_elems._56_5_ = 0;
  local_178.data._M_elems[0xf]._1_3_ = 0;
  local_178.exp = 0;
  local_178.neg = false;
  if (&local_178 != &(this->nonzeroFactor).m_backend) {
    local_178.data._M_elems._0_8_ = *(undefined8 *)(this->nonzeroFactor).m_backend.data._M_elems;
    local_178.data._M_elems._8_8_ =
         *(undefined8 *)((this->nonzeroFactor).m_backend.data._M_elems + 2);
    local_178.data._M_elems._16_8_ =
         *(undefined8 *)((this->nonzeroFactor).m_backend.data._M_elems + 4);
    local_178.data._M_elems._24_8_ =
         *(undefined8 *)((this->nonzeroFactor).m_backend.data._M_elems + 6);
    local_178.data._M_elems._32_8_ =
         *(undefined8 *)((this->nonzeroFactor).m_backend.data._M_elems + 8);
    local_178.data._M_elems._40_8_ =
         *(undefined8 *)((this->nonzeroFactor).m_backend.data._M_elems + 10);
    local_178.data._M_elems._48_8_ =
         *(undefined8 *)((this->nonzeroFactor).m_backend.data._M_elems + 0xc);
    uVar2 = *(undefined8 *)((this->nonzeroFactor).m_backend.data._M_elems + 0xe);
    local_178.data._M_elems._56_5_ = SUB85(uVar2,0);
    local_178.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar2 >> 0x28);
    local_178.exp = (this->nonzeroFactor).m_backend.exp;
    local_178.neg = (this->nonzeroFactor).m_backend.neg;
    local_178.fpclass = (this->nonzeroFactor).m_backend.fpclass;
    local_178.prec_elem = (this->nonzeroFactor).m_backend.prec_elem;
  }
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=(&local_178,&local_128)
  ;
  lVar4 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::extract_signed_long_long
                    (&local_178);
  lVar6 = -0x80000000;
  if (-0x80000000 < lVar4) {
    lVar6 = lVar4;
  }
  if (0x7ffffffe < lVar6) {
    lVar6 = 0x7fffffff;
  }
  this->lastNzCount = (int)lVar6;
  if (this->thestatus != SINGULAR) {
    return;
  }
  puVar5 = (undefined8 *)__cxa_allocate_exception(0x28);
  local_178.data._M_elems._0_8_ = local_178.data._M_elems + 4;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_178,"Cannot factorize singular matrix","");
  *puVar5 = &PTR__SPxException_0069d438;
  puVar5[1] = puVar5 + 3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(puVar5 + 1),local_178.data._M_elems._0_8_,
             local_178.data._M_elems._0_8_ + local_178.data._M_elems._8_8_);
  *puVar5 = &PTR__SPxException_0069d650;
  __cxa_throw(puVar5,&SPxStatusException::typeinfo,SPxException::~SPxException);
}

Assistant:

void SPxBasisBase<R>::factorize()
{

   assert(factor != nullptr);

   if(!matrixIsSetup)
      loadDesc(thedesc);

   assert(matrixIsSetup);

   updateCount = 0;

   switch(factor->load(matrix.get_ptr(), matrix.size()))
   {
   case SLinSolver<R>::OK :
      if(status() == SINGULAR)
         setStatus(REGULAR);

      factorized = true;
      minStab = factor->stability();

      // This seems always to be about 1e-7
      if(minStab > 1e-4)
         minStab *= 0.001;

      if(minStab > 1e-5)
         minStab *= 0.01;

      if(minStab > 1e-6)
         minStab *= 0.1;

      break;

   case SLinSolver<R>::SINGULAR :
      setStatus(SINGULAR);
      factorized = false;
      break;

   default :
      SPX_MSG_ERROR(std::cerr << "EBASIS08 error: unknown status of factorization.\n";)
      factorized = false;
      throw SPxInternalCodeException("XBASIS01 This should never happen.");
   }

   // get nonzero count of factorization
   lastMem    = factor->memory();
   // compute fill ratio between factorization and basis matrix (multiplied with tolerance)
   lastFill   = fillFactor * R(lastMem) / R(nzCount > 0 ? nzCount : 1);
   lastNzCount = int(nonzeroFactor * R(nzCount > 0 ? nzCount : 1));

   if(status() == SINGULAR)
   {
      throw SPxStatusException("Cannot factorize singular matrix");
   }
}